

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall psy::C::Lexer::lex(Lexer *this)

{
  pointer *ppSVar1;
  uint uVar2;
  SyntaxTree *pSVar3;
  iterator __position;
  undefined1 uVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  size_type sVar10;
  char *pcVar11;
  ulong uVar12;
  StringLiteral *pSVar13;
  ulong uVar14;
  _Elt_pointer puVar15;
  SyntaxToken *pSVar16;
  byte bVar17;
  long lVar18;
  pointer __s;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  expansions;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> braces;
  allocator<char> local_171;
  SyntaxToken local_170;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_138;
  ulong local_120;
  undefined1 local_118 [32];
  _Elt_pointer local_f8;
  _Map_pointer ppuStack_f0;
  _Elt_pointer local_e8;
  _Elt_pointer puStack_e0;
  _Elt_pointer local_d8;
  _Map_pointer ppuStack_d0;
  string local_c8;
  SyntaxToken local_a8;
  SyntaxToken local_68;
  
  pSVar3 = this->tree_;
  SyntaxToken::SyntaxToken(&local_68,(SyntaxTree *)0x0);
  SyntaxTree::addToken(pSVar3,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  pSVar3 = this->tree_;
  SyntaxTree::filePath_abi_cxx11_((string *)local_118,pSVar3);
  SyntaxTree::relayLineDirective(pSVar3,0,1,(string *)local_118);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  SyntaxTree::relayLineStart(this->tree_,0);
  local_138.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (_Elt_pointer)0x0;
  ppuStack_d0 = (_Map_pointer)0x0;
  local_e8 = (_Elt_pointer)0x0;
  puStack_e0 = (_Elt_pointer)0x0;
  local_f8 = (_Elt_pointer)0x0;
  ppuStack_f0 = (_Map_pointer)0x0;
  local_118._16_8_ = (void *)0x0;
  local_118._24_8_ = 0;
  local_118._0_8_ = (pointer)0x0;
  local_118._8_8_ = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,0);
  SyntaxToken::SyntaxToken(&local_170,this->tree_);
  local_120 = 0;
LAB_002baec2:
  yylex(this,&local_170);
  uVar2 = local_170.charOffset_;
joined_r0x002baed2:
  do {
    local_170.charOffset_ = uVar2;
    if (((local_170.field_7.BF_all_._0_1_ & 1) == 0) || (local_170.syntaxK_ != HashToken)) break;
    yylex(this,&local_170);
    uVar4 = local_170.field_7.BF_all_._0_1_;
    if ((local_170.field_7.BF_all_._0_1_ & 1) == 0) {
      if ((local_170.syntaxK_ == IdentifierToken) &&
         (iVar9 = strcmp(*(char **)&((local_170.field_10.identifier_)->super_Lexeme).field_0x10,
                         "expansion"), iVar9 == 0)) {
        yylex(this,&local_170);
        uVar2 = local_170.charOffset_;
        if (((local_170.field_7.BF_all_._0_1_ & 1) == 0) && (local_170.syntaxK_ == IdentifierToken))
        {
          pcVar11 = *(char **)&((local_170.field_10.identifier_)->super_Lexeme).field_0x10;
          iVar9 = strcmp(pcVar11,"begin");
          if (iVar9 == 0) {
            yylex(this,&local_170);
            yylex(this,&local_170);
            yylex(this,&local_170);
            yylex(this,&local_170);
            while ((uVar2 = local_170.charOffset_, local_170.syntaxK_ != EndOfFile &&
                   ((local_170.field_7.BF_all_._0_1_ & 1) == 0))) {
              if (local_170.syntaxK_ == IntegerConstantToken) {
                pcVar11 = SyntaxToken::valueText_c_str(&local_170);
                uVar12 = strtoul(pcVar11,(char **)0x0,0);
                yylex(this,&local_170);
                yylex(this,&local_170);
                pcVar11 = SyntaxToken::valueText_c_str(&local_170);
                uVar14 = strtoul(pcVar11,(char **)0x0,0);
                yylex(this,&local_170);
                local_c8._M_dataplus._M_p._0_4_ = (undefined4)uVar12;
                local_c8._M_dataplus._M_p._4_4_ = (undefined4)uVar14;
                std::
                vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                          ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                            *)&local_138,(pair<unsigned_int,_unsigned_int> *)&local_c8);
              }
              else if (local_170.syntaxK_ == OperatorName_COMPLToken) {
                yylex(this,&local_170);
                pcVar11 = SyntaxToken::valueText_c_str(&local_170);
                uVar12 = strtoul(pcVar11,(char **)0x0,0);
                ppVar6 = local_138.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                ppVar5 = local_138.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar18 = (long)local_138.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_138.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::resize(&local_138,(lVar18 >> 3) + uVar12);
                __s = (pointer)(lVar18 + (long)local_138.
                                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                if (__s != local_138.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
                  memset(__s,0,((long)local_138.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                (long)ppVar5 +
                                (-8 - ((long)&ppVar6->first +
                                      (long)&(local_138.
                                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->first)) &
                               0xfffffffffffffff8U) + 8);
                }
                yylex(this,&local_170);
              }
            }
          }
          else {
            iVar9 = strcmp(pcVar11,"end");
            uVar2 = local_170.charOffset_;
            if (iVar9 == 0) {
              if (local_138.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_138.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_138.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_138.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              local_120 = 0;
              yylex(this,&local_170);
              uVar2 = local_170.charOffset_;
            }
          }
        }
        goto joined_r0x002baed2;
      }
      if (((uVar4 & 1) == 0) &&
         ((local_170.syntaxK_ == IdentifierToken &&
          (iVar9 = strcmp(*(char **)&((local_170.field_10.identifier_)->super_Lexeme).field_0x10,
                          "line"), iVar9 == 0)))) {
        yylex(this,&local_170);
      }
    }
    if (((local_170.field_7.BF_all_._0_1_ & 1) == 0) && (local_170.syntaxK_ == IntegerConstantToken)
       ) {
      pcVar11 = SyntaxToken::valueText_c_str(&local_170);
      uVar12 = strtoul(pcVar11,(char **)0x0,0);
      yylex(this,&local_170);
      if (((local_170.field_7.BF_all_._0_1_ & 1) == 0) && (local_170.syntaxK_ == StringLiteralToken)
         ) {
        pSVar13 = SyntaxTree::findOrInsertStringLiteral
                            (this->tree_,
                             *(char **)&((local_170.field_10.identifier_)->super_Lexeme).field_0x10,
                             *(uint *)&((local_170.field_10.identifier_)->super_Lexeme).field_0x8);
        pSVar3 = this->tree_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,*(char **)&(pSVar13->super_Lexeme).field_0x10,&local_171);
        SyntaxTree::relayLineDirective(pSVar3,uVar2,(uint)uVar12,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_) !=
            &local_c8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_),
                          local_c8.field_2._M_allocated_capacity + 1);
        }
        yylex(this,&local_170);
      }
    }
    while ((uVar2 = local_170.charOffset_, (local_170.field_7.BF_all_._0_1_ & 1) == 0 &&
           (local_170.syntaxK_ != EndOfFile))) {
      yylex(this,&local_170);
    }
  } while( true );
  if (local_170.syntaxK_ == CloseBraceToken) {
    if (local_e8 == (_Elt_pointer)local_118._16_8_) goto LAB_002bb27e;
    puVar15 = local_e8;
    if (local_e8 == puStack_e0) {
      puVar15 = ppuStack_d0[-1] + 0x80;
    }
    uVar2 = puVar15[-1];
    if (local_e8 == puStack_e0) {
      operator_delete(puStack_e0,0x200);
      puStack_e0 = ppuStack_d0[-1];
      local_d8 = puStack_e0 + 0x80;
      local_e8 = puStack_e0 + 0x7f;
      ppuStack_d0 = ppuStack_d0 + -1;
    }
    else {
      local_e8 = local_e8 + -1;
    }
    sVar10 = SyntaxTree::tokenCount(this->tree_);
    if (uVar2 < sVar10) {
      sVar10 = SyntaxTree::tokenCount(this->tree_);
      pSVar16 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar2);
      pSVar16->matchingBracket_ = sVar10;
    }
  }
  else if (local_170.syntaxK_ == OpenBraceToken) {
    sVar10 = SyntaxTree::tokenCount(this->tree_);
    local_c8._M_dataplus._M_p._0_4_ = (undefined4)sVar10;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,(uint *)&local_c8);
  }
  else {
LAB_002bb27e:
    bVar7 = SyntaxToken::isComment(&local_170);
    if (bVar7) {
      pSVar3 = this->tree_;
      __position._M_current =
           (pSVar3->comments_).
           super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pSVar3->comments_).
          super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<psy::C::SyntaxToken,std::allocator<psy::C::SyntaxToken>>::
        _M_realloc_insert<psy::C::SyntaxToken_const&>
                  ((vector<psy::C::SyntaxToken,std::allocator<psy::C::SyntaxToken>> *)
                   &pSVar3->comments_,__position,&local_170);
      }
      else {
        (__position._M_current)->field_10 = local_170.field_10;
        (__position._M_current)->field_7 =
             (anon_union_2_2_2d0bec1f_for_SyntaxToken_7)
             (short)CONCAT71(local_170._33_7_,local_170.field_7.BF_all_._0_1_);
        *(short *)&(__position._M_current)->field_0x22 = local_170._34_2_;
        (__position._M_current)->lineno_ = local_170.lineno_;
        *(ulong *)&(__position._M_current)->column_ =
             CONCAT17(local_170._47_1_,
                      CONCAT25(local_170._45_2_,
                               CONCAT41(local_170._41_4_,(undefined1)local_170.column_)));
        (__position._M_current)->byteOffset_ = local_170.byteOffset_;
        (__position._M_current)->charOffset_ = local_170.charOffset_;
        (__position._M_current)->matchingBracket_ = local_170.matchingBracket_;
        (__position._M_current)->tree_ = local_170.tree_;
        (__position._M_current)->syntaxK_ = local_170.syntaxK_;
        (__position._M_current)->byteSize_ = local_170.byteSize_;
        (__position._M_current)->charSize_ = local_170.charSize_;
        *(short *)&(__position._M_current)->field_0xe = local_170._14_2_;
        ppSVar1 = &(pSVar3->comments_).
                   super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      if (local_170.syntaxK_ != Keyword_ExtPSY_omission) goto LAB_002bb420;
    }
  }
  if ((local_138.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_138.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (uVar12 = local_120 & 0xffffffff,
     (ulong)((long)local_138.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_138.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12)) {
    bVar8 = 0;
    bVar17 = 0;
  }
  else {
    if (local_138.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].first == 0) {
      bVar17 = 0x10;
    }
    else {
      SyntaxTree::relayExpansion
                (this->tree_,local_170.charOffset_,
                 local_138.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12]);
      bVar17 = 0;
    }
    local_120 = (ulong)((int)local_120 + 1);
    bVar8 = 8;
  }
  local_170.field_7.BF_all_._0_1_ = local_170.field_7.BF_all_._0_1_ & 0xe7 | bVar8 | bVar17;
  local_a8.field_10 = local_170.field_10;
  local_a8._41_4_ = local_170._41_4_;
  local_a8._45_2_ = local_170._45_2_;
  local_a8._47_1_ = local_170._47_1_;
  local_a8.matchingBracket_ = local_170.matchingBracket_;
  local_a8.tree_ = local_170.tree_;
  local_a8.field_7.BF_all_._0_1_ = local_170.field_7.BF_all_._0_1_;
  SyntaxTree::addToken(this->tree_,&local_a8);
  SyntaxToken::~SyntaxToken(&local_a8);
LAB_002bb420:
  if (local_170.syntaxK_ == EndOfFile) {
    if (local_e8 != (_Elt_pointer)local_118._16_8_) {
      do {
        puVar15 = local_e8;
        if (local_e8 == puStack_e0) {
          puVar15 = ppuStack_d0[-1] + 0x80;
        }
        uVar2 = puVar15[-1];
        sVar10 = SyntaxTree::tokenCount(this->tree_);
        pSVar16 = SyntaxTree::tokenAt(this->tree_,(ulong)uVar2);
        pSVar16->matchingBracket_ = sVar10;
        if (local_e8 == puStack_e0) {
          operator_delete(puStack_e0,0x200);
          puStack_e0 = ppuStack_d0[-1];
          local_d8 = puStack_e0 + 0x80;
          local_e8 = puStack_e0 + 0x7f;
          ppuStack_d0 = ppuStack_d0 + -1;
        }
        else {
          local_e8 = local_e8 + -1;
        }
      } while (local_e8 != (_Elt_pointer)local_118._16_8_);
    }
    SyntaxToken::~SyntaxToken(&local_170);
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
              ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
    if (local_138.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  goto LAB_002baec2;
}

Assistant:

void Lexer::lex()
{
    // Marker (invalid) token.
    tree_->addToken(SyntaxToken(nullptr));

    // Line and column...
    tree_->relayLineDirective(0, 1, tree_->filePath());
    tree_->relayLineStart(0);
    std::vector<std::pair<unsigned int, unsigned int>> expansions;
    unsigned int curExpansionIdx = 0;

    // SyntaxKind::Open/close brace tracking.
    std::stack<unsigned> braces;

    SyntaxToken tk(tree_);

    do {
        yylex(&tk);

LexEntry:
        if (tk.isAtStartOfLine() && tk.isKind(SyntaxKind::HashToken)) {
            auto offset = tk.charOffset_;
            yylex(&tk);

            if (!tk.isAtStartOfLine()
                    && tk.isKind(SyntaxKind::IdentifierToken)
                    && !strcmp(tk.identifier_->c_str(), kExpansion)) {
                // A Qt Creator-specific macro mark.
                yylex(&tk);

                if (!tk.isAtStartOfLine() && tk.isKind(SyntaxKind::IdentifierToken)) {
                    if (!strcmp(tk.identifier_->c_str(), kBegin)) {
                        // The start of an expansion section.
                        yylex(&tk);

                        // Gather where it happens and its length.
                        yylex(&tk);
                        yylex(&tk); // Skip the separating comma.
                        yylex(&tk);

                        // Gather the real line and column from the upcoming tokens; only
                        // relevant for tokens which are expanded but not generated.
                        while (!tk.isKind(SyntaxKind::EndOfFile)
                                    && !tk.isAtStartOfLine()) {
                            // A ~ means that the a number of generated tokens follows;
                            // otherwise, what follows is data.
                            if (tk.isKind(SyntaxKind::TildeToken)) {
                                yylex(&tk);

                                // Get the total number of generated tokens and specify "null"
                                // information for them.
                                auto all = strtoul(tk.valueText_c_str(), 0, 0);
                                auto prevSize = expansions.size();
                                expansions.resize(prevSize + all);
                                std::fill(expansions.begin() + prevSize,
                                          expansions.end(),
                                          std::make_pair(0, 0));

                                yylex(&tk);
                            }
                            else if (tk.isKind(SyntaxKind::IntegerConstantToken)) {
                                auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);
                                yylex(&tk); // Skip the separating colon.
                                auto column = strtoul(tk.valueText_c_str(), 0, 0);
                                yylex(&tk);

                                // Store line and column for this non-generated token.
                                expansions.push_back(std::make_pair(lineno, column));
                            }
                        }
                    }
                    else if (!strcmp(tk.identifier_->c_str(), kEnd)) {
                        // The end of an expansion section.
                        expansions.clear();
                        curExpansionIdx = 0;
                        yylex(&tk);
                    }
                }
            }
            else {
                // A regular preprocessor directive.
                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IdentifierToken)
                        && !strcmp(tk.identifier_->c_str(), kLine)) {
                    yylex(&tk);
                }

                if (!tk.isAtStartOfLine()
                        && tk.isKind(SyntaxKind::IntegerConstantToken)) {
                    auto lineno = strtoul(tk.valueText_c_str(), 0, 0);
                    yylex(&tk);

                    if (!tk.isAtStartOfLine()
                            && tk.isKind(SyntaxKind::StringLiteralToken)) {
                        auto fileName = tree_->findOrInsertStringLiteral(tk.string_->c_str(), tk.string_->size());
                        tree_->relayLineDirective(offset, lineno, fileName->c_str());
                        yylex(&tk);
                    }
                }

                while (!tk.isAtStartOfLine() && !tk.isKind(SyntaxKind::EndOfFile)) {
                    // Skip the remaining of the line, ignoring a possible include.
                    yylex(&tk);
                }
            }
            goto LexEntry;
        }
        else if (tk.kind() == SyntaxKind::OpenBraceToken) {
            braces.push(tree_->tokenCount());
        }
        else if (tk.kind() == SyntaxKind::CloseBraceToken && !braces.empty()) {
            auto idx = braces.top();
            braces.pop();
            if (idx < tree_->tokenCount())
                tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
        }
        else if (tk.isComment()) {
            tree_->comments_.push_back(tk);
            if (tk.kind() != SyntaxKind::Keyword_ExtPSY_omission)
                continue;
        }

        bool isExpanded = false;
        bool isGenerated = false;
        if (!expansions.empty() && curExpansionIdx < expansions.size()) {
            isExpanded = true;
            const std::pair<unsigned int, unsigned int>& p = expansions[curExpansionIdx];
            if (p.first)
                tree_->relayExpansion(tk.charStart(), p);
            else
                isGenerated = true;
            ++curExpansionIdx;
        }
        tk.BF_.expanded_ = isExpanded;
        tk.BF_.generated_ = isGenerated;

        tree_->addToken(tk);
    }
    while (tk.kind() != SyntaxKind::EndOfFile);

    for (; !braces.empty(); braces.pop()) {
        auto idx = braces.top();
        tree_->tokenAt(idx).matchingBracket_ = tree_->tokenCount();
    }
}